

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void D_RemoveNextCharEvent(void)

{
  BYTE BVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar2 = eventhead;
  uVar4 = (ulong)eventtail;
  if ((events[uVar4].type != '\x04') || (events[uVar4].subtype != '\x01')) {
    __assert_fail("events[eventtail].type == EV_GUI_Event && events[eventtail].subtype == EV_GUI_KeyDown"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_main.cpp"
                  ,0x163,"void D_RemoveNextCharEvent()");
  }
  while( true ) {
    iVar3 = (int)uVar4;
    if ((iVar3 == iVar2) || (events[iVar3].type != '\x04')) {
      return;
    }
    BVar1 = events[iVar3].subtype;
    if ((BVar1 != '\x04') && (BVar1 != '\x01')) break;
    events[iVar3].type = '\0';
    if (BVar1 == '\x04') {
      return;
    }
    uVar4 = (ulong)(iVar3 + 1U & 0x7f);
  }
  return;
}

Assistant:

void D_RemoveNextCharEvent()
{
	assert(events[eventtail].type == EV_GUI_Event && events[eventtail].subtype == EV_GUI_KeyDown);
	for (int evnum = eventtail; evnum != eventhead; evnum = (evnum+1) & (MAXEVENTS-1))
	{
		event_t *ev = &events[evnum];
		if (ev->type != EV_GUI_Event)
			break;
		if (ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_Char)
		{
			ev->type = EV_None;
			if (ev->subtype == EV_GUI_Char)
				break;
		}
		else
		{
			break;
		}
	}
}